

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_decision(bitstream *str,h264_cabac_context *cabac,int ctxIdx,uint32_t *binVal)

{
  uint uVar1;
  int iVar2;
  int codIRangeLPS;
  int qCodIRangeIdx;
  uint32_t *binVal_local;
  int ctxIdx_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  if (ctxIdx == -1) {
    str_local._4_4_ = h264_cabac_bypass(str,cabac,binVal);
  }
  else if (ctxIdx == 0x114) {
    str_local._4_4_ = h264_cabac_terminate(str,cabac,binVal);
  }
  else {
    uVar1 = (uint)rangeTabLPS[cabac->pStateIdx[ctxIdx]][(int)(cabac->codIRange >> 6 & 3)];
    cabac->codIRange = cabac->codIRange - uVar1;
    if (str->dir == VS_ENCODE) {
      if (*binVal != (uint)cabac->valMPS[ctxIdx]) {
        cabac->codIOffset = cabac->codIRange + cabac->codIOffset;
        cabac->codIRange = uVar1;
      }
    }
    else if (cabac->codIOffset < cabac->codIRange) {
      *binVal = (uint)cabac->valMPS[ctxIdx];
    }
    else {
      *binVal = (uint)((cabac->valMPS[ctxIdx] != '\0' ^ 0xffU) & 1);
      cabac->codIOffset = cabac->codIOffset - cabac->codIRange;
      cabac->codIRange = uVar1;
    }
    if (*binVal == (uint)cabac->valMPS[ctxIdx]) {
      cabac->pStateIdx[ctxIdx] =
           "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$%&\'()*+,-./0123456789:;<=>>?"
           [cabac->pStateIdx[ctxIdx]];
    }
    else {
      if (cabac->pStateIdx[ctxIdx] == '\0') {
        cabac->valMPS[ctxIdx] = (cabac->valMPS[ctxIdx] != '\0' ^ 0xffU) & 1;
      }
      cabac->pStateIdx[ctxIdx] = ""[cabac->pStateIdx[ctxIdx]];
    }
    iVar2 = h264_cabac_renorm(str,cabac);
    if (iVar2 == 0) {
      cabac->BinCount = cabac->BinCount + 1;
      str_local._4_4_ = 0;
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int h264_cabac_decision(struct bitstream *str, struct h264_cabac_context *cabac, int ctxIdx, uint32_t *binVal) {
	if (ctxIdx == -1)
		return h264_cabac_bypass(str, cabac, binVal);
	if (ctxIdx == H264_CABAC_CTXIDX_TERMINATE)
		return h264_cabac_terminate(str, cabac, binVal);
	int qCodIRangeIdx = cabac->codIRange >> 6 & 3;
	int codIRangeLPS = rangeTabLPS[cabac->pStateIdx[ctxIdx]][qCodIRangeIdx];
	cabac->codIRange -= codIRangeLPS;
	if (str->dir == VS_ENCODE) {
		if (*binVal != cabac->valMPS[ctxIdx]) {
			cabac->codIOffset += cabac->codIRange;
			cabac->codIRange = codIRangeLPS;
		}
	} else {
		if (cabac->codIOffset >= cabac->codIRange) {
			*binVal = !cabac->valMPS[ctxIdx];
			cabac->codIOffset -= cabac->codIRange;
			cabac->codIRange = codIRangeLPS;
		} else {
			*binVal = cabac->valMPS[ctxIdx];
		}
	}
	if (*binVal == cabac->valMPS[ctxIdx]) {
		cabac->pStateIdx[ctxIdx] = transIdxMPS[cabac->pStateIdx[ctxIdx]];
	} else {
		if (cabac->pStateIdx[ctxIdx] == 0)
			cabac->valMPS[ctxIdx] = !cabac->valMPS[ctxIdx];
		cabac->pStateIdx[ctxIdx] = transIdxLPS[cabac->pStateIdx[ctxIdx]];
	}
	if (h264_cabac_renorm(str, cabac))
		return 1;
	cabac->BinCount++;
	return 0;
}